

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAxyzDD::SetNoSpeedNoAcceleration(ChNodeFEAxyzDD *this)

{
  ChNodeFEAxyzD::SetNoSpeedNoAcceleration(&this->super_ChNodeFEAxyzD);
  if (this != (ChNodeFEAxyzDD *)&DAT_00b90960) {
    (this->DD_dt).m_data[0] = VNULL;
    (this->DD_dt).m_data[1] = DAT_00b90ac0;
    (this->DD_dt).m_data[2] = DAT_00b90ac8;
  }
  if (this != (ChNodeFEAxyzDD *)&std::__ioinit) {
    (this->DD_dtdt).m_data[0] = VNULL;
    (this->DD_dtdt).m_data[1] = DAT_00b90ac0;
    (this->DD_dtdt).m_data[2] = DAT_00b90ac8;
  }
  return;
}

Assistant:

void ChNodeFEAxyzDD::SetNoSpeedNoAcceleration() {
    ChNodeFEAxyzD::SetNoSpeedNoAcceleration();

    DD_dt = VNULL;
    DD_dtdt = VNULL;
}